

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::AnyEq::operator()
          (AnyEq *this,vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *a,
          vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *b)

{
  Card *pCVar1;
  bool bVar2;
  Card *lhs;
  Card *rhs;
  
  lhs = (a->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (a->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  rhs = (b->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
        _M_impl.super__Vector_impl_data._M_start;
  if ((long)pCVar1 - (long)lhs ==
      (long)(b->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
            ._M_impl.super__Vector_impl_data._M_finish - (long)rhs) {
    if (lhs == pCVar1) {
      return lhs == pCVar1;
    }
    bVar2 = solitaire::cards::operator==(lhs,rhs);
    if (bVar2) {
      do {
        rhs = rhs + 1;
        lhs = lhs + 1;
        if (lhs == pCVar1) {
          return lhs == pCVar1;
        }
        bVar2 = solitaire::cards::operator==(lhs,rhs);
      } while (bVar2);
    }
  }
  return false;
}

Assistant:

inline internal::LtMatcher<Rhs> Lt(Rhs x) {
  return internal::LtMatcher<Rhs>(x);
}